

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.cpp
# Opt level: O1

void __thiscall ze_lib::context_t::context_t(context_t *this)

{
  int iVar1;
  char *__s2;
  bool bVar2;
  
  bVar2 = false;
  this->initOnce = 0;
  this->initOnceDrivers = 0;
  (this->initOnceSysMan)._M_once = 0;
  (this->tracingLayerEnableCounter).super___atomic_base<unsigned_int>._M_i = 0;
  (this->zeDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zetDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zesDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zelTracingDdiTable).Tracer.pfnCreate = (zel_pfnTracerCreate_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnDestroy = (zel_pfnTracerDestroy_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnSetPrologues = (zel_pfnTracerSetPrologues_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnSetEpilogues = (zel_pfnTracerSetEpilogues_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnSetEnabled = (zel_pfnTracerSetEnabled_t)0x0;
  (this->pTracingZeDdiTable)._M_b._M_p = (__pointer_type)0x0;
  this->isInitialized = false;
  this->zesInuse = false;
  this->zeInuse = false;
  this->debugTraceEnabled = false;
  this->tracing_lib = (void *)0x0;
  this->dynamicTracingSupported = true;
  this->loaderDriverGet = (ze_pfnDriverGet_t)0x0;
  __s2 = getenv("ZE_ENABLE_LOADER_DEBUG_TRACE");
  if (__s2 != (char *)0x0) {
    iVar1 = strcmp("0",__s2);
    if (iVar1 == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = strcmp("1",__s2);
      bVar2 = iVar1 == 0;
    }
  }
  this->debugTraceEnabled = bVar2;
  return;
}

Assistant:

__zedlllocal context_t::context_t()
    {
        debugTraceEnabled = getenv_tobool( "ZE_ENABLE_LOADER_DEBUG_TRACE" );
    }